

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestLogParser.cpp
# Opt level: O2

void __thiscall xe::TestLogParser::reset(TestLogParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  SessionInfo local_f8;
  
  ContainerFormatParser::clear(&this->m_containerParser);
  de::SharedPtr<xe::TestCaseResultData>::clear(&this->m_currentCaseData);
  __s = &local_f8.releaseName.field_2;
  memset(__s,0,0xd0);
  local_f8.releaseName._M_string_length = 0;
  local_f8.releaseId._M_dataplus._M_p = (pointer)&local_f8.releaseId.field_2;
  local_f8.releaseId.field_2._M_local_buf[0] = '\0';
  local_f8.targetName._M_dataplus._M_p = (pointer)&local_f8.targetName.field_2;
  local_f8.targetName.field_2._M_local_buf[0] = '\0';
  local_f8.candyTargetName._M_dataplus._M_p = (pointer)&local_f8.candyTargetName.field_2;
  local_f8.candyTargetName.field_2._M_local_buf[0] = '\0';
  local_f8.configName._M_dataplus._M_p = (pointer)&local_f8.configName.field_2;
  local_f8.configName.field_2._M_local_buf[0] = '\0';
  local_f8.resultName._M_dataplus._M_p = (pointer)&local_f8.resultName.field_2;
  local_f8.resultName.field_2._M_local_buf[0] = '\0';
  local_f8.timestamp._M_dataplus._M_p = (pointer)&local_f8.timestamp.field_2;
  local_f8.timestamp.field_2._M_local_buf[0] = '\0';
  local_f8.releaseName._M_dataplus._M_p = (pointer)__s;
  SessionInfo::operator=(&this->m_sessionInfo,&local_f8);
  SessionInfo::~SessionInfo(&local_f8);
  this->m_inSession = false;
  return;
}

Assistant:

void TestLogParser::reset (void)
{
	m_containerParser.clear();
	m_currentCaseData.clear();
	m_sessionInfo	= SessionInfo();
	m_inSession		= false;
}